

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

u32 sqlite3FkOldmask(Parse *pParse,Table *pTab)

{
  uint local_40;
  uint local_3c;
  Index *local_38;
  Index *pIdx;
  FKey *pFStack_28;
  int i;
  FKey *p;
  Table *pTStack_18;
  u32 mask;
  Table *pTab_local;
  Parse *pParse_local;
  
  p._4_4_ = 0;
  if ((pParse->db->flags & 0x4000) != 0) {
    for (pFStack_28 = pTab->pFKey; pFStack_28 != (FKey *)0x0; pFStack_28 = pFStack_28->pNextFrom) {
      for (pIdx._4_4_ = 0; pIdx._4_4_ < pFStack_28->nCol; pIdx._4_4_ = pIdx._4_4_ + 1) {
        if (pFStack_28->aCol[pIdx._4_4_].iFrom < 0x20) {
          local_3c = 1 << ((byte)pFStack_28->aCol[pIdx._4_4_].iFrom & 0x1f);
        }
        else {
          local_3c = 0xffffffff;
        }
        p._4_4_ = local_3c | p._4_4_;
      }
    }
    pTStack_18 = pTab;
    pTab_local = (Table *)pParse;
    for (pFStack_28 = sqlite3FkReferences(pTab); pFStack_28 != (FKey *)0x0;
        pFStack_28 = pFStack_28->pNextTo) {
      local_38 = (Index *)0x0;
      sqlite3FkLocateIndex((Parse *)pTab_local,pTStack_18,pFStack_28,&local_38,(int **)0x0);
      if (local_38 != (Index *)0x0) {
        for (pIdx._4_4_ = 0; pIdx._4_4_ < (int)(uint)local_38->nKeyCol; pIdx._4_4_ = pIdx._4_4_ + 1)
        {
          if (local_38->aiColumn[pIdx._4_4_] < 0x20) {
            local_40 = 1 << ((byte)local_38->aiColumn[pIdx._4_4_] & 0x1f);
          }
          else {
            local_40 = 0xffffffff;
          }
          p._4_4_ = local_40 | p._4_4_;
        }
      }
    }
  }
  return p._4_4_;
}

Assistant:

SQLITE_PRIVATE u32 sqlite3FkOldmask(
  Parse *pParse,                  /* Parse context */
  Table *pTab                     /* Table being modified */
){
  u32 mask = 0;
  if( pParse->db->flags&SQLITE_ForeignKeys ){
    FKey *p;
    int i;
    for(p=pTab->pFKey; p; p=p->pNextFrom){
      for(i=0; i<p->nCol; i++) mask |= COLUMN_MASK(p->aCol[i].iFrom);
    }
    for(p=sqlite3FkReferences(pTab); p; p=p->pNextTo){
      Index *pIdx = 0;
      sqlite3FkLocateIndex(pParse, pTab, p, &pIdx, 0);
      if( pIdx ){
        for(i=0; i<pIdx->nKeyCol; i++){
          assert( pIdx->aiColumn[i]>=0 );
          mask |= COLUMN_MASK(pIdx->aiColumn[i]);
        }
      }
    }
  }
  return mask;
}